

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.cpp
# Opt level: O2

ProString * __thiscall
QMakeProject::expand
          (ProString *__return_storage_ptr__,QMakeProject *this,QString *expr,QString *where,
          int line)

{
  VisitReturn VVar1;
  ProFile *this_00;
  long in_FS_OFFSET;
  QStringView contents;
  QArrayDataPointer<ProString> local_58;
  ushort *tokPtr;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)&__return_storage_ptr__->m_file = 0xaaaaaaaaaaaaaaaa;
  __return_storage_ptr__->m_hash = 0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_string).d.size = -0x5555555555555556;
  __return_storage_ptr__->m_offset = -0x55555556;
  __return_storage_ptr__->m_length = -0x55555556;
  (__return_storage_ptr__->m_string).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->m_string).d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  ProString::ProString(__return_storage_ptr__);
  contents.m_data = (expr->d).ptr;
  contents.m_size = (expr->d).size;
  this_00 = QMakeParser::parsedProBlock
                      ((this->super_QMakeEvaluator).m_parser,contents,0,where,line,ValueGrammar);
  if (this_00->m_ok == true) {
    (this->super_QMakeEvaluator).m_current.pro = this_00;
    (this->super_QMakeEvaluator).m_current.line = 0;
    tokPtr = (ushort *)(this_00->m_proitems).d.ptr;
    if ((char16_t *)tokPtr == (char16_t *)0x0) {
      tokPtr = (ushort *)&QString::_empty;
    }
    local_58.d = (Data *)0x0;
    local_58.ptr = (ProString *)0x0;
    local_58.size = 0;
    VVar1 = QMakeEvaluator::expandVariableReferences
                      (&this->super_QMakeEvaluator,&tokPtr,1,(ProStringList *)&local_58,true);
    if (VVar1 == ReturnError) {
      exit(3);
    }
    if (local_58.size != 0) {
      ProString::operator=(__return_storage_ptr__,local_58.ptr);
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  }
  ProFile::deref(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProString QMakeProject::expand(const QString &expr, const QString &where, int line)
{
    ProString ret;
    ProFile *pro = m_parser->parsedProBlock(QStringView(expr), 0, where, line,
                                            QMakeParser::ValueGrammar);
    if (pro->isOk()) {
        m_current.pro = pro;
        m_current.line = 0;
        const ushort *tokPtr = pro->tokPtr();
        ProStringList result;
        if (expandVariableReferences(tokPtr, 1, &result, true) == ReturnError)
            exit(3);
        if (!result.isEmpty())
            ret = result.at(0);
    }
    pro->deref();
    return ret;
}